

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusinternalfilters.cpp
# Opt level: O0

QDBusMessage
propertyWriteReply(QDBusMessage *msg,QString *interface_name,QByteArray *property_name,int status)

{
  QLatin1StringView str;
  QAnyStringView s;
  QLatin1StringView str_00;
  QAnyStringView s_00;
  QLatin1StringView str_01;
  QAnyStringView s_01;
  QLatin1StringView str_02;
  QAnyStringView s_02;
  QLatin1StringView str_03;
  QAnyStringView s_03;
  QLatin1StringView str_04;
  QAnyStringView s_04;
  bool bVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDX;
  QAnyStringView *in_RSI;
  QDBusMessagePrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  ArgBase *argBases [4];
  ArgBase *argBases_1 [4];
  QDBusMessage *in_stack_fffffffffffffc40;
  QAnyStringView *in_stack_fffffffffffffc48;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffffc50;
  QString *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  ErrorType EVar3;
  QDBusMessagePrivate *pQVar4;
  undefined1 local_2c8 [24];
  storage_type *local_2b0;
  undefined1 local_2a0 [40];
  QLatin1StringView local_278;
  QLatin1StringView local_268;
  undefined1 local_258 [40];
  QLatin1StringView local_230;
  QLatin1StringView local_220;
  undefined1 local_210 [56];
  undefined1 local_1d8 [24];
  qsizetype local_1c0;
  char *local_1b8;
  undefined1 local_1a0 [40];
  undefined1 local_178 [24];
  qsizetype local_160;
  char *local_158;
  ulong local_150;
  ArgBase **local_148;
  undefined1 local_120 [24];
  qsizetype local_108;
  char *local_100;
  undefined1 local_e8 [40];
  undefined1 local_c0 [24];
  qsizetype local_a8;
  char *local_a0;
  ulong local_98;
  ArgBase **local_90;
  ulong local_88;
  ArgBase **local_80;
  ulong local_78;
  ArgBase **local_70;
  ulong local_68;
  ArgBase **local_60;
  ulong local_58;
  ArgBase **local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  EVar3 = (ErrorType)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_R8D) {
  case 0:
    memset(local_2c8,0,0x18);
    QList<QVariant>::QList((QList<QVariant> *)0x19fa97);
    QDBusMessage::createReply
              ((QDBusMessage *)in_stack_fffffffffffffc58,
               (QVariantList *)in_stack_fffffffffffffc50.m_data);
    QList<QVariant>::~QList((QList<QVariant> *)0x19faba);
    break;
  case 1:
    propertyNotFoundError((QDBusMessage *)in_RDI,(QString *)in_RSI,(QByteArray *)in_RDX.m_data);
    break;
  case 2:
    pQVar4 = in_RDI;
    local_220 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    EVar3 = in_RDX._4_4_;
    bVar1 = QString::isEmpty((QString *)0x19f3a4);
    if (bVar1) {
      local_230 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    }
    else {
      local_230 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    }
    QLatin1String::QLatin1String
              ((QLatin1String *)in_stack_fffffffffffffc50.m_data,
               (QByteArray *)in_stack_fffffffffffffc48);
    local_a8 = local_220.m_size;
    local_a0 = local_220.m_data;
    str.m_data = (char *)in_RSI;
    str.m_size = (qsizetype)in_stack_fffffffffffffc50.m_data;
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc48,str);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffc50.m_data,
               (QString *)in_stack_fffffffffffffc48);
    s.m_size = (size_t)in_RSI;
    s.field_0.m_data = in_stack_fffffffffffffc50.m_data;
    QtPrivate::qStringLikeToArg(s);
    local_108 = local_230.m_size;
    local_100 = local_230.m_data;
    str_00.m_data = (char *)in_RSI;
    str_00.m_size = (qsizetype)in_stack_fffffffffffffc50.m_data;
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc48,str_00);
    s_00.m_size = (size_t)in_RSI;
    s_00.field_0.m_data = in_stack_fffffffffffffc50.m_data;
    QtPrivate::qStringLikeToArg(s_00);
    str_01.m_data = (char *)in_RSI;
    str_01.m_size = (qsizetype)in_stack_fffffffffffffc50.m_data;
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffc48,str_01);
    s_01.m_size = (size_t)in_RSI;
    s_01.field_0.m_data = in_stack_fffffffffffffc50.m_data;
    QtPrivate::qStringLikeToArg(s_01);
    local_78 = local_98;
    local_70 = local_90;
    local_48 = local_c0;
    local_40 = local_e8;
    local_38 = local_120;
    local_30 = 0;
    local_88 = local_98;
    local_80 = local_90;
    QtPrivate::argToQString((QAnyStringView *)local_210,local_98,local_90);
    QDBusMessage::createErrorReply((QDBusMessage *)pQVar4,EVar3,(QString *)in_RSI);
    QString::~QString((QString *)0x19f6b7);
    break;
  case 3:
    pQVar4 = in_RDI;
    local_268 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_RSI,(size_t)in_stack_fffffffffffffc40);
    bVar1 = QString::isEmpty((QString *)0x19f6fb);
    if (bVar1) {
      local_278 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_RSI,(size_t)in_stack_fffffffffffffc40);
    }
    else {
      local_278 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_RSI,(size_t)in_stack_fffffffffffffc40);
    }
    QLatin1String::QLatin1String((QLatin1String *)in_RDX.m_data,(QByteArray *)in_RSI);
    local_160 = local_268.m_size;
    local_158 = local_268.m_data;
    str_02.m_data = (char *)in_stack_fffffffffffffc58;
    str_02.m_size = (qsizetype)in_RDX.m_data;
    QAnyStringView::QAnyStringView(in_RSI,str_02);
    QAnyStringView::QAnyStringView((QAnyStringView *)in_RDX.m_data,(QString *)in_RSI);
    s_02.m_size = (size_t)in_stack_fffffffffffffc58;
    s_02.field_0.m_data = in_RDX.m_data;
    QtPrivate::qStringLikeToArg(s_02);
    local_1c0 = local_278.m_size;
    local_1b8 = local_278.m_data;
    str_03.m_data = (char *)in_stack_fffffffffffffc58;
    str_03.m_size = (qsizetype)in_RDX.m_data;
    QAnyStringView::QAnyStringView(in_RSI,str_03);
    s_03.m_size = (size_t)in_stack_fffffffffffffc58;
    s_03.field_0.m_data = in_RDX.m_data;
    QtPrivate::qStringLikeToArg(s_03);
    str_04.m_data = (char *)in_stack_fffffffffffffc58;
    str_04.m_size = (qsizetype)in_RDX.m_data;
    QAnyStringView::QAnyStringView(in_RSI,str_04);
    s_04.m_size = (size_t)in_stack_fffffffffffffc58;
    s_04.field_0.m_data = in_RDX.m_data;
    QtPrivate::qStringLikeToArg(s_04);
    local_58 = local_150;
    local_50 = local_148;
    local_28 = local_178;
    local_20 = local_1a0;
    local_18 = local_1d8;
    local_10 = 0;
    local_68 = local_150;
    local_60 = local_148;
    QtPrivate::argToQString((QAnyStringView *)local_258,local_150,local_148);
    QDBusMessage::createErrorReply((QDBusMessage *)pQVar4,EVar3,in_stack_fffffffffffffc58);
    QString::~QString((QString *)0x19fa02);
    break;
  case 4:
    pQVar4 = in_RDI;
    QByteArrayView::QByteArrayView<15ul>
              ((QByteArrayView *)in_stack_fffffffffffffc50.m_data,
               (char (*) [15])in_stack_fffffffffffffc48);
    QVar2.m_data = local_2b0;
    QVar2.m_size = (qsizetype)local_2a0;
    QString::fromLatin1(QVar2);
    QDBusMessage::createErrorReply((QDBusMessage *)pQVar4,EVar3,in_stack_fffffffffffffc58);
    QString::~QString((QString *)0x19fa6b);
    break;
  default:
    QDBusMessage::QDBusMessage(in_stack_fffffffffffffc40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDBusMessage)in_RDI;
}

Assistant:

static QDBusMessage propertyWriteReply(const QDBusMessage &msg, const QString &interface_name,
                                       const QByteArray &property_name, int status)
{
    switch (status) {
    case PropertyNotFound:
        return propertyNotFoundError(msg, interface_name, property_name);
    case PropertyTypeMismatch:
        return msg.createErrorReply(QDBusError::InvalidArgs,
                                    "Invalid arguments for writing to property %1%2%3"_L1
                                    .arg(interface_name,
                                         interface_name.isEmpty() ? ""_L1 : "."_L1,
                                         QLatin1StringView(property_name)));
    case PropertyReadOnly:
        return msg.createErrorReply(QDBusError::PropertyReadOnly,
                                    "Property %1%2%3 is read-only"_L1
                                    .arg(interface_name,
                                         interface_name.isEmpty() ? ""_L1 : "."_L1,
                                         QLatin1StringView(property_name)));
    case PropertyWriteFailed:
        return msg.createErrorReply(QDBusError::InternalError,
                                    QString::fromLatin1("Internal error"));

    case PropertyWriteSuccess:
        return msg.createReply();
    }
    Q_ASSERT_X(false, "", "Should not be reached");
    return QDBusMessage();
}